

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O1

int Map_NodeIncRefPhaseAct(Map_Node_t *pNode,int fPhase)

{
  int iVar1;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Map_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                  ,0x57,"int Map_NodeIncRefPhaseAct(Map_Node_t *, int)");
  }
  if (pNode->pCutBest[0] != (Map_Cut_t *)0x0) {
    if (pNode->pCutBest[1] != (Map_Cut_t *)0x0) {
      iVar1 = pNode->nRefAct[fPhase];
      pNode->nRefAct[fPhase] = iVar1 + 1;
      return iVar1;
    }
    if (pNode->pCutBest[0] != (Map_Cut_t *)0x0) goto LAB_003ff5dc;
  }
  if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
    __assert_fail("pNode->pCutBest[0] || pNode->pCutBest[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                  ,0x5a,"int Map_NodeIncRefPhaseAct(Map_Node_t *, int)");
  }
LAB_003ff5dc:
  iVar1 = pNode->nRefAct[2];
  pNode->nRefAct[2] = iVar1 + 1;
  return iVar1;
}

Assistant:

int Map_NodeIncRefPhaseAct( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefAct[fPhase]++;
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
    return pNode->nRefAct[2]++;
}